

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderLocalName(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  _xmlNode *cur;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    pxVar2 = (xmlChar *)0x0;
  }
  else {
    pxVar1 = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      pxVar1 = reader->curnode;
    }
    if (pxVar1->type - XML_ELEMENT_NODE < 2) {
      pxVar2 = readerStrdup(reader,pxVar1->name);
      return pxVar2;
    }
    if (pxVar1->type != XML_NAMESPACE_DECL) {
      pxVar2 = xmlTextReaderName(reader);
      return pxVar2;
    }
    cur = pxVar1->children;
    if (cur == (_xmlNode *)0x0) {
      cur = (_xmlNode *)0x1e035f;
    }
    pxVar2 = xmlStrdup((xmlChar *)cur);
    if (pxVar2 == (xmlChar *)0x0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return pxVar2;
}

Assistant:

xmlChar *
xmlTextReaderLocalName(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    if (node->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) node;
	if (ns->prefix == NULL)
	    return(readerStrdup(reader, BAD_CAST "xmlns"));
	else
	    return(readerStrdup(reader, ns->prefix));
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE))
	return(xmlTextReaderName(reader));
    return(readerStrdup(reader, node->name));
}